

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

void __thiscall rengine::Node::append(Node *this,Node *child)

{
  bool bVar1;
  Node *child_local;
  Node *this_local;
  
  if (child == (Node *)0x0) {
    __assert_fail("child",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,0x62,"void rengine::Node::append(Node *)");
  }
  bVar1 = hasChild(this,child);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!hasChild(child)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,99,"void rengine::Node::append(Node *)");
  }
  if (child->m_parent != (Node *)0x0) {
    __assert_fail("child->m_parent == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,100,"void rengine::Node::append(Node *)");
  }
  if (child->m_next == (Node *)0x0) {
    if (child->m_prev == (Node *)0x0) {
      if (this->m_child == (Node *)0x0) {
        child->m_next = child;
        child->m_prev = child;
        this->m_child = child;
      }
      else {
        this->m_child->m_prev->m_next = child;
        child->m_prev = this->m_child->m_prev;
        this->m_child->m_prev = child;
        child->m_next = this->m_child;
      }
      setParent(child,this);
      return;
    }
    __assert_fail("child->m_prev == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                  ,0x66,"void rengine::Node::append(Node *)");
  }
  __assert_fail("child->m_next == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/node.h"
                ,0x65,"void rengine::Node::append(Node *)");
}

Assistant:

void append(Node *child) {
        assert(child);
        assert(!hasChild(child));
        assert(child->m_parent == 0);
        assert(child->m_next == 0);
        assert(child->m_prev == 0);

        if (!m_child) {
            child->m_next = child;
            child->m_prev = child;
            m_child = child;
        } else {
            m_child->m_prev->m_next = child;
            child->m_prev = m_child->m_prev;
            m_child->m_prev = child;
            child->m_next = m_child;
        }
        child->setParent(this);
    }